

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexElement
          (OgreBinarySerializer *this,VertexData *dest)

{
  uint16_t uVar1;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_01;
  string local_210;
  string local_1e0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  undefined1 local_28 [8];
  VertexElement element;
  VertexData *dest_local;
  OgreBinarySerializer *this_local;
  
  element._8_8_ = dest;
  VertexElement::VertexElement((VertexElement *)local_28);
  local_28._2_2_ = Read<unsigned_short>(this);
  uVar1 = Read<unsigned_short>(this);
  element._0_4_ = ZEXT24(uVar1);
  uVar1 = Read<unsigned_short>(this);
  element._4_4_ = ZEXT24(uVar1);
  local_28._4_2_ = Read<unsigned_short>(this);
  local_28._0_2_ = Read<unsigned_short>(this);
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>(&local_1c0,(char (*) [22])"    - Vertex element ");
  VertexElement::SemanticToString_abi_cxx11_(&local_1e0,(VertexElement *)local_28);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1c0,&local_1e0);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(char (*) [10])0xba2778);
  VertexElement::TypeToString_abi_cxx11_(&local_210,(VertexElement *)local_28);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,&local_210);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(char (*) [8])" index=");
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(unsigned_short *)local_28);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(char (*) [9])" source=");
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar2,(unsigned_short *)(local_28 + 2));
  Formatter::basic_formatter::operator_cast_to_string(&local_48,this_01);
  Logger::debug(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1e0);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1c0);
  std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::push_back
            ((vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_> *)
             (element._8_8_ + 0x80),(value_type *)local_28);
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexElement(VertexData *dest)
{
    VertexElement element;
    element.source = Read<uint16_t>();
    element.type = static_cast<VertexElement::Type>(Read<uint16_t>());
    element.semantic = static_cast<VertexElement::Semantic>(Read<uint16_t>());
    element.offset = Read<uint16_t>();
    element.index = Read<uint16_t>();

    ASSIMP_LOG_DEBUG_F( "    - Vertex element ", element.SemanticToString(), " of type ",
        element.TypeToString(), " index=", element.index, " source=", element.source);

    dest->vertexElements.push_back(element);
}